

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O1

int KINGetNumPrecSolves(void *kinmem,long *npsolves)

{
  int iVar1;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  KINLsMem local_18;
  KINMem local_10;
  
  iVar1 = kinLs_AccessLMem(kinmem,"KINGetNumPrecSolves",&local_10,&local_18);
  if (iVar1 == 0) {
    *npsolves = local_18->nps;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int KINGetNumPrecSolves(void *kinmem, long int *npsolves)
{
  KINMem   kin_mem;
  KINLsMem kinls_mem;
  int      retval;

  /* access KINLsMem structure; set output value and return */
  retval = kinLs_AccessLMem(kinmem, "KINGetNumPrecSolves",
                            &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS)  return(retval);
  *npsolves = kinls_mem->nps;
  return(KINLS_SUCCESS);
}